

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTPNSym::gen_code_call(CTPNSym *this,int discard,int argc,int varargs,CTcNamedArgs *named_args)

{
  CTcPrsSymtab *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CTcSymbol *pCVar3;
  
  this_00 = G_cs->symtab_;
  iVar1 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xc])();
  iVar2 = (*(this->super_CTPNSymBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
            [0xd])(this);
  pCVar3 = CTcPrsSymtab::find_or_def_prop_implied
                     (this_00,(char *)CONCAT44(extraout_var,iVar1),CONCAT44(extraout_var_00,iVar2),0
                      ,(byte)G_cs->field_0xa8 & 1);
  UNRECOVERED_JUMPTABLE =
       (pCVar3->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
       [0x1b];
  (*UNRECOVERED_JUMPTABLE)
            (pCVar3,(ulong)(uint)discard,(ulong)(uint)argc,(ulong)(uint)varargs,named_args,
             UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void CTPNSym::gen_code_call(int discard, int argc, int varargs,
                            CTcNamedArgs *named_args)
{
    /*
     *   Look up our symbol in the symbol table, then ask the resulting
     *   symbol to generate the appropriate call.  The symbol is
     *   implicitly a property (if in a method context), since that's the
     *   only kind of undefined symbol that we could be calling.  
     */
    G_cs->get_symtab()
        ->find_or_def_prop_implied(get_sym_text(), get_sym_text_len(),
                                   FALSE, G_cs->is_self_available())
        ->gen_code_call(discard, argc, varargs, named_args);
}